

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O2

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  int _w;
  ulong uVar7;
  undefined4 *puVar8;
  ulong uVar9;
  int iVar10;
  int sw;
  long lVar11;
  undefined4 *puVar12;
  long local_d8;
  Mat m;
  Mat local_78;
  
  iVar1 = bottom_blob->c;
  iVar3 = this->stride;
  _w = bottom_blob->w / iVar3;
  uVar9 = (long)bottom_blob->h / (long)iVar3;
  iVar10 = (int)uVar9;
  Mat::create(top_blob,_w,iVar10,iVar3 * iVar1 * iVar3,bottom_blob->elemsize,opt->blob_allocator);
  iVar3 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (_w < 1) {
      _w = 0;
    }
    uVar9 = uVar9 & 0xffffffff;
    if (iVar10 < 1) {
      uVar9 = 0;
    }
    iVar3 = 0;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    for (iVar10 = 0; iVar10 != iVar3; iVar10 = iVar10 + 1) {
      Mat::channel(&m,bottom_blob,iVar10);
      uVar2 = (ulong)(uint)this->stride;
      for (lVar6 = 0; lVar6 < (int)uVar2; lVar6 = lVar6 + 1) {
        local_d8 = 0;
        for (lVar11 = 0; iVar4 = (int)uVar2, lVar11 < iVar4; lVar11 = lVar11 + 1) {
          if (this->mode == 0) {
            iVar4 = (int)lVar11 + (iVar4 * iVar10 + (int)lVar6) * iVar4;
          }
          else {
            iVar4 = ((int)lVar11 + iVar4 * (int)lVar6) * iVar1 + iVar10;
          }
          Mat::channel(&local_78,top_blob,iVar4);
          puVar12 = (undefined4 *)local_78.data;
          Mat::~Mat(&local_78);
          uVar2 = (ulong)this->stride;
          puVar5 = (undefined4 *)((long)m.w * m.elemsize * lVar6 + local_d8 + (long)m.data);
          for (uVar7 = 0; puVar8 = puVar5, iVar4 = _w, uVar7 != uVar9; uVar7 = uVar7 + 1) {
            while (iVar4 != 0) {
              *puVar12 = *puVar8;
              puVar12 = puVar12 + 1;
              puVar8 = puVar8 + uVar2;
              iVar4 = iVar4 + -1;
            }
            puVar5 = (undefined4 *)((long)puVar5 + (long)m.w * m.elemsize * uVar2);
          }
          local_d8 = local_d8 + 4;
        }
      }
      Mat::~Mat(&m);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                int p;
                if (mode == 0)
                    p = q * stride * stride + sh * stride + sw;
                else // if (mode == 1)
                    p = (sh * stride + sw) * channels + q;

                float* outptr = top_blob.channel(p);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i * stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}